

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.h
# Opt level: O2

void __thiscall Refal2::CArbitraryInteger::CArbitraryInteger(CArbitraryInteger *this)

{
  (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Zero(this);
  return;
}

Assistant:

CArbitraryInteger() { Zero(); }